

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

int32_t cornelich::util::thread_id_bits(void)

{
  byte bVar1;
  int iVar2;
  runtime_error *this;
  uint local_220 [2];
  uint v;
  long local_210;
  ifstream is;
  
  std::ifstream::ifstream(&local_210,"/proc/sys/kernel/threads-max",8);
  bVar1 = std::ios::operator!((ios *)((long)&local_210 + *(long *)(local_210 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::istream::operator>>((istream *)&local_210,local_220);
    iVar2 = log2_bits(local_220[0] - 1);
    std::ifstream::~ifstream(&local_210);
    return iVar2 + 1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Cannot access /proc/sys/kernel/threads-max");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::int32_t thread_id_bits()
{
    std::ifstream is("/proc/sys/kernel/threads-max");
    if(!is)
        throw std::runtime_error("Cannot access /proc/sys/kernel/threads-max");
    unsigned int v;
    is >> v;
    return log2_bits(v - 1) + 1;
}